

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ConnectRequest *
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::attachCounter
          (ConnectRequest *__return_storage_ptr__,ConnectRequest *request,ConnectionCounter *counter
          )

{
  ConnectRequest *pCVar1;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_30;
  ConnectionCounter *local_20;
  ConnectionCounter *counter_local;
  ConnectRequest *request_local;
  
  local_20 = counter;
  counter_local = (ConnectionCounter *)request;
  request_local = __return_storage_ptr__;
  mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>(counter);
  Own<kj::AsyncIoStream,_std::nullptr_t>::
  attach<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            (&local_30,(ConnectionCounter *)&request->connection);
  Own<kj::AsyncIoStream,_std::nullptr_t>::operator=
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(counter_local + 1),&local_30);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own(&local_30);
  pCVar1 = mv<kj::HttpClient::ConnectRequest>((ConnectRequest *)counter_local);
  HttpClient::ConnectRequest::ConnectRequest(__return_storage_ptr__,pCVar1);
  return __return_storage_ptr__;
}

Assistant:

static ConnectRequest attachCounter(
      ConnectRequest&& request,
      ConnectionCounter&& counter) {
    // Notice here that we are only attaching the counter to the connection stream. In the case
    // where the connect tunnel request is rejected and the status promise resolves with an
    // errorBody, there is a possibility that the consuming code might drop the connection stream
    // and the counter while the error body stream is still be consumed. Technically speaking that
    // means we could potentially exceed our concurrency limit temporarily but we consider that
    // acceptable here since the error body is an exception path (plus not requiring that we
    // attach to the errorBody keeps ConnectionCounter from having to be a refcounted heap
    // allocation).
    request.connection = request.connection.attach(kj::mv(counter));
    return kj::mv(request);
  }